

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

int EncodeStreamHook(void *input,void *data2)

{
  uint32_t *palette;
  VP8LBackwardRefs *refs;
  uint32_t *palette_00;
  VP8LHashChain *hash_chain;
  int *piVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int width;
  int height;
  int iVar7;
  uint32_t uVar8;
  long lVar9;
  WebPPicture *picture;
  VP8LBitWriter *src;
  VP8LEncoder *enc;
  long lVar10;
  uint8_t *puVar11;
  WebPPicture *pWVar12;
  code *pcVar13;
  bool bVar14;
  long lVar15;
  void *pvVar16;
  uint16_t *puVar17;
  int iVar18;
  int iVar19;
  WebPEncodingError WVar20;
  WebPEncodingError WVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  void *ptr;
  void *ptr_00;
  void *pvVar27;
  uint16_t *puVar28;
  uint8_t *puVar29;
  ulong uVar30;
  HuffmanTree *huff_tree;
  uint16_t *puVar31;
  VP8LHistogramSet *image_histo;
  uint32_t *puVar32;
  HuffmanTreeToken *tokens;
  int quality;
  uint32_t uVar33;
  long lVar34;
  long lVar35;
  uint uVar36;
  uint uVar37;
  int iVar38;
  ulong uVar39;
  byte bVar40;
  VP8LEncoderARGBContent VVar41;
  byte bVar42;
  bool bVar43;
  vp8l_atype_t vVar44;
  byte bVar45;
  ulong uVar46;
  uint uVar47;
  uint uVar48;
  ulong uVar49;
  byte bVar50;
  void *pvVar51;
  uint uVar52;
  ulong uVar53;
  uint uVar54;
  HuffmanTreeCode *huffman_code;
  uint8_t uVar55;
  uint *puVar56;
  long lVar57;
  uint32_t *puVar58;
  ulong uVar59;
  VP8LHistogram *local_1ae8;
  uint32_t *local_1ac0;
  HuffmanTreeCode *local_1ab0;
  int local_1a5c;
  int local_1a58;
  uint8_t *local_1a40;
  ulong local_1a08;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  undefined4 local_1938;
  uint32_t idx_map [256];
  uint32_t palette_sorted [256];
  uint16_t buffer [2048];
  
  lVar9 = *input;
  picture = *(WebPPicture **)((long)input + 8);
  src = *(VP8LBitWriter **)((long)input + 0x10);
  enc = *(VP8LEncoder **)((long)input + 0x18);
  iVar3 = *(int *)((long)input + 0x20);
  uVar4 = *(uint *)((long)input + 0x104);
  iVar5 = *(int *)((long)input + 0x108);
  lVar10 = *(long *)((long)input + 0x110);
  quality = (int)*(float *)(lVar9 + 4);
  iVar6 = *(int *)(lVar9 + 8);
  width = picture->width;
  puVar29 = src->cur_;
  puVar11 = src->buf_;
  bw_init.bits_ = src->bits_;
  bw_init.used_ = src->used_;
  bw_init._12_4_ = *(undefined4 *)&src->field_0xc;
  bw_init.buf_ = src->buf_;
  bw_init.cur_ = src->cur_;
  bw_init.end_ = src->end_;
  bw_init.error_ = src->error_;
  bw_init._44_4_ = *(undefined4 *)&src->field_0x2c;
  height = picture->height;
  iVar7 = src->used_;
  iVar18 = VP8LBitWriterInit(&bw_best,0);
  WVar20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
  if (iVar18 == 0) goto LAB_001375db;
  if ((int)uVar4 < 2) {
    if (uVar4 == 1) goto LAB_00135c4f;
  }
  else {
    iVar18 = VP8LBitWriterClone(src,&bw_best);
    if (iVar18 == 0) goto LAB_001375db;
LAB_00135c4f:
    iVar7 = ((int)puVar29 - (int)puVar11) + (iVar7 + 7 >> 3);
    refs = enc->refs_;
    palette_00 = enc->palette_sorted_;
    palette = enc->palette_;
    hash_chain = &enc->hash_chain_;
    local_1a40 = (uint8_t *)0xffffffffffffffff;
    uVar59 = 0;
    local_1a5c = 0;
    local_1a58 = 0;
    do {
      lVar15 = uVar59 * 0x1c;
      uVar26 = *(uint *)((long)input + lVar15 + 0x24);
      uVar36 = uVar26 & 0xfffffffe;
      uVar24 = (uint)(uVar26 == 5 || (uVar26 & 0xfffffffd) == 1);
      uVar26 = 0;
      if (iVar5 == 0) {
        uVar26 = uVar24;
      }
      if (uVar36 == 4) {
        uVar26 = 0;
      }
      enc->use_palette_ = (uint)(uVar36 == 4);
      enc->use_subtract_green_ = (uint)(uVar36 == 2);
      enc->use_predict_ = uVar24;
      if (iVar6 == 0) {
        uVar26 = 0;
      }
      enc->use_cross_color_ = uVar26;
      enc->cache_bits_ = 0;
      VP8LBackwardRefsClear(refs);
      VP8LBackwardRefsClear(enc->refs_ + 1);
      iVar18 = *(int *)(lVar9 + 0x5c);
      VVar41 = kEncoderNone;
      uVar26 = (uint)(iVar6 == 0);
      if (iVar18 < 100) {
        if (enc->use_palette_ != 0) {
          enc->argb_content_ = kEncoderNone;
          goto LAB_00135e5d;
        }
        if (enc->use_predict_ != 0) {
          enc->argb_content_ = kEncoderNone;
LAB_001363e0:
          pWVar12 = enc->pic_;
          iVar18 = pWVar12->width;
          iVar19 = pWVar12->height;
          WVar20 = AllocateTransformBuffer(enc,iVar18,iVar19);
          if (WVar20 == VP8_ENC_OK) {
            if (enc->argb_content_ != kEncoderARGB) {
              if (0 < iVar19) {
                puVar58 = pWVar12->argb;
                puVar32 = enc->argb_;
                do {
                  memcpy(puVar32,puVar58,(long)iVar18 * 4);
                  puVar58 = puVar58 + pWVar12->argb_stride;
                  puVar32 = puVar32 + iVar18;
                  iVar19 = iVar19 + -1;
                } while (iVar19 != 0);
              }
              enc->argb_content_ = kEncoderARGB;
            }
            goto LAB_00136a2a;
          }
          goto LAB_001375d5;
        }
        WVar21 = AllocateTransformBuffer(enc,width,height);
        WVar20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
        if ((WVar21 == VP8_ENC_OK) &&
           ((VVar41 = kEncoderNearLossless, enc->argb_content_ == kEncoderNearLossless ||
            (iVar19 = VP8ApplyNearLossless(picture,*(int *)(lVar9 + 0x5c),enc->argb_), iVar19 != 0))
           )) goto LAB_00135e4b;
        goto LAB_001375db;
      }
LAB_00135e4b:
      enc->argb_content_ = VVar41;
      if (enc->use_palette_ == 0) {
        if (99 < iVar18) goto LAB_001363e0;
      }
      else {
LAB_00135e5d:
        iVar18 = *(int *)((long)input + lVar15 + 0x28);
        if (iVar18 == 1) {
          uVar39 = (ulong)enc->palette_size_;
          memcpy(palette,palette_00,uVar39 * 4);
          if (0 < (long)uVar39) {
            uVar30 = 0;
            bVar40 = 0;
            uVar24 = 0;
            do {
              uVar36 = palette_00[uVar30];
              uVar54 = (uVar36 | 0xff00) - (uVar24 & 0xff00ff);
              uVar24 = uVar36 - (uVar24 & 0xff00);
              uVar37 = uVar54 >> 0x10 & 0xff;
              bVar50 = 2 - (uVar37 < 0x80);
              if (uVar37 == 0) {
                bVar50 = (byte)(uVar54 >> 0x10);
              }
              uVar37 = uVar24 >> 8 & 0xff;
              bVar45 = (0x7f < uVar37) * '\b' + 8;
              if (uVar37 == 0) {
                bVar45 = (byte)(uVar24 >> 8);
              }
              bVar42 = 0x80;
              if ((uVar54 & 0xff) < 0x80) {
                bVar42 = 0x40;
              }
              if ((uVar54 & 0xff) == 0) {
                bVar42 = 0;
              }
              bVar40 = bVar42 | bVar40 | bVar50 | bVar45;
              uVar30 = uVar30 + 1;
              uVar24 = uVar36;
            } while (uVar39 != uVar30);
            if ((bVar40 * '\x02' & bVar40) != 0) {
              uVar30 = 0;
              uVar33 = 0;
              do {
                uVar24 = 0xffffffff;
                uVar49 = uVar30 & 0xffffffff;
                uVar46 = uVar30;
                do {
                  uVar54 = (palette[uVar46] | 0xff0000) - (uVar33 & 0xff00ff00);
                  uVar37 = (palette[uVar46] | 0xff00) - (uVar33 & 0xff00ff);
                  uVar23 = uVar37 & 0xff;
                  uVar36 = 0x100 - uVar23;
                  if (uVar23 < 0x81) {
                    uVar36 = uVar23;
                  }
                  uVar52 = uVar54 >> 8 & 0xff;
                  uVar23 = 0x100 - uVar52;
                  if (uVar52 < 0x81) {
                    uVar23 = uVar52;
                  }
                  uVar52 = uVar37 >> 0x10 & 0xff;
                  uVar37 = 0x100 - uVar52;
                  if (uVar52 < 0x81) {
                    uVar37 = uVar52;
                  }
                  uVar52 = 0x100 - (uVar54 >> 0x18);
                  if (uVar54 < 0x81000000) {
                    uVar52 = uVar54 >> 0x18;
                  }
                  uVar52 = uVar52 + (uVar37 + uVar23 + uVar36) * 9;
                  if (uVar52 < uVar24) {
                    uVar49 = uVar46 & 0xffffffff;
                  }
                  if (uVar52 <= uVar24) {
                    uVar24 = uVar52;
                  }
                  uVar46 = uVar46 + 1;
                } while (uVar39 != uVar46);
                uVar33 = palette[(int)uVar49];
                palette[(int)uVar49] = palette[uVar30];
                palette[uVar30] = uVar33;
                uVar30 = uVar30 + 1;
              } while (uVar30 != uVar39);
            }
          }
        }
        else if (iVar18 == 0) {
          memcpy(palette,palette_00,(long)enc->palette_size_ << 2);
        }
        else {
          uVar24 = enc->palette_size_;
          uVar39 = (ulong)uVar24;
          if (1 < uVar39) {
            pWVar12 = enc->pic_;
            ptr = WebPSafeCalloc((ulong)(uVar24 * uVar24),4);
            if (ptr != (void *)0x0) {
              puVar56 = pWVar12->argb;
              uVar36 = *puVar56;
              memset(idx_map,0,0x400);
              ptr_00 = WebPSafeMalloc((long)pWVar12->width * 2,4);
              if (ptr_00 != (void *)0x0) {
                iVar18 = pWVar12->width;
                PrepareMapToPalette(palette_00,uVar24,palette_sorted,idx_map);
                iVar19 = pWVar12->height;
                if (0 < iVar19) {
                  uVar36 = ~uVar36;
                  uVar30 = (ulong)(uint)pWVar12->width;
                  uVar33 = 0;
                  iVar22 = 0;
                  pvVar16 = (void *)((long)ptr_00 + (long)iVar18 * 4);
                  pvVar51 = ptr_00;
                  do {
                    pvVar27 = pvVar16;
                    if (0 < (int)uVar30) {
                      lVar35 = 0;
                      do {
                        uVar54 = puVar56[lVar35];
                        if (uVar54 != uVar36) {
                          if (palette_sorted[0] == uVar54) {
                            lVar57 = 0;
                          }
                          else {
                            uVar37 = 0;
                            uVar36 = uVar24;
                            do {
                              uVar23 = (int)(uVar36 + uVar37) >> 1;
                              lVar57 = (long)(int)uVar23;
                              if (palette_sorted[lVar57] < uVar54) {
                                uVar37 = uVar23;
                                uVar23 = uVar36;
                              }
                              uVar36 = uVar23;
                            } while (palette_sorted[lVar57] != uVar54);
                          }
                          uVar33 = idx_map[lVar57];
                          uVar36 = uVar54;
                        }
                        *(uint32_t *)((long)pvVar27 + lVar35 * 4) = uVar33;
                        if ((lVar35 != 0) &&
                           (uVar8 = *(uint32_t *)((long)pvVar27 + lVar35 * 4 + -4), uVar33 != uVar8)
                           ) {
                          piVar1 = (int *)((long)ptr + (ulong)(uVar33 * uVar24 + uVar8) * 4);
                          *piVar1 = *piVar1 + 1;
                          piVar1 = (int *)((long)ptr + (ulong)(uVar8 * uVar24 + uVar33) * 4);
                          *piVar1 = *piVar1 + 1;
                        }
                        if ((iVar22 != 0) &&
                           (uVar8 = *(uint32_t *)((long)pvVar51 + lVar35 * 4), uVar33 != uVar8)) {
                          piVar1 = (int *)((long)ptr + (ulong)(uVar33 * uVar24 + uVar8) * 4);
                          *piVar1 = *piVar1 + 1;
                          piVar1 = (int *)((long)ptr + (ulong)(uVar8 * uVar24 + uVar33) * 4);
                          *piVar1 = *piVar1 + 1;
                        }
                        lVar35 = lVar35 + 1;
                        uVar30 = (ulong)pWVar12->width;
                      } while (lVar35 < (long)uVar30);
                      iVar19 = pWVar12->height;
                    }
                    puVar56 = puVar56 + pWVar12->argb_stride;
                    iVar22 = iVar22 + 1;
                    pvVar16 = pvVar51;
                    pvVar51 = pvVar27;
                  } while (iVar22 < iVar19);
                }
                WebPSafeFree(ptr_00);
                lVar35 = 0;
                uVar54 = 0;
                uVar37 = 0;
                uVar36 = 0;
                do {
                  uVar30 = 0;
                  uVar23 = 0;
                  do {
                    uVar23 = uVar23 + *(int *)((long)ptr +
                                              (ulong)(uint)((int)lVar35 + (int)uVar30) * 4);
                    uVar30 = uVar30 + 1;
                  } while (uVar39 != uVar30);
                  uVar54 = uVar54 & 0xff;
                  if (uVar36 < uVar23) {
                    uVar36 = uVar23;
                    uVar54 = uVar37;
                  }
                  uVar37 = uVar37 + 1;
                  lVar35 = lVar35 + uVar39;
                } while (uVar37 != uVar24);
                uVar37 = uVar54 & 0xff;
                uVar46 = 0;
                uVar30 = 0;
                uVar36 = 0;
                do {
                  uVar23 = *(uint *)((long)ptr + (ulong)(uVar24 * uVar37 + (int)uVar46) * 4);
                  uVar30 = uVar30 & 0xff;
                  if (uVar36 < uVar23) {
                    uVar30 = uVar46 & 0xffffffff;
                    uVar36 = uVar23;
                  }
                  uVar46 = uVar46 + 1;
                } while (uVar39 != uVar46);
                local_1938._0_2_ = CONCAT11((char)uVar30,(char)uVar54);
                if (uVar24 - 2 == 0) {
                  uVar36 = 0;
                }
                else {
                  buffer._0_8_ = ((ulong)buffer._0_8_ >> 8 & 0xffffff) << 8;
                  uVar49 = 0;
                  uVar36 = 0;
                  puVar31 = buffer;
                  uVar46 = uVar30 & 0xff;
                  do {
                    if (((uVar54 & 0xff) != uVar49) && ((uVar30 & 0xff) != uVar49)) {
                      uVar53 = (ulong)uVar36;
                      *(char *)(buffer + uVar53 * 4) = (char)uVar49;
                      uVar23 = *(int *)((long)ptr + uVar46 * 4) +
                               *(int *)((long)ptr + (ulong)uVar37 * 4);
                      *(uint *)(buffer + uVar53 * 4 + 2) = uVar23;
                      if (*(uint *)(puVar31 + 2) < uVar23) {
                        puVar31 = buffer + uVar53 * 4;
                      }
                      uVar36 = uVar36 + 1;
                    }
                    uVar49 = uVar49 + 1;
                    uVar46 = (ulong)((int)uVar46 + uVar24);
                    uVar37 = uVar37 + uVar24;
                  } while (uVar39 != uVar49);
                  uVar30 = (ulong)(uVar24 - 3);
                  uVar46 = (ulong)(uVar24 - 2);
                  uVar36 = 0;
                  iVar18 = 1;
                  uVar54 = 1;
                  while( true ) {
                    bVar40 = (byte)*puVar31;
                    uVar23 = uVar54 + 1;
                    uVar49 = (ulong)uVar36 % (ulong)uVar24;
                    uVar37 = uVar23;
                    if ((uint)uVar49 != uVar23) {
                      iVar22 = 0;
                      iVar19 = iVar18;
                      uVar52 = uVar36;
                      do {
                        uVar52 = uVar52 + 1;
                        iVar22 = iVar22 + *(int *)((long)ptr +
                                                  (ulong)((uint)*(byte *)((long)&local_1938 + uVar49
                                                                         ) + uVar24 * bVar40) * 4) *
                                          iVar19;
                        uVar49 = (ulong)uVar52 % (ulong)uVar24;
                        iVar19 = iVar19 + -2;
                      } while ((uint)uVar49 != uVar23);
                      if (0 < iVar22) {
                        if (uVar36 == 0) {
                          uVar36 = uVar24;
                        }
                        uVar23 = uVar36 - 1;
                        uVar36 = uVar23;
                        uVar37 = uVar54;
                      }
                    }
                    uVar54 = uVar37;
                    *(byte *)((long)&local_1938 + (ulong)uVar23) = bVar40;
                    *(undefined8 *)puVar31 = *(undefined8 *)(buffer + uVar46 * 4 + -4);
                    uVar46 = uVar46 - 1;
                    if (uVar46 == 0) break;
                    puVar28 = buffer;
                    uVar49 = 0;
                    puVar31 = puVar28;
                    do {
                      uVar37 = *(int *)(puVar28 + 2) +
                               *(int *)((long)ptr +
                                       (ulong)((uint)(byte)*puVar28 + bVar40 * uVar24) * 4);
                      *(uint *)(puVar28 + 2) = uVar37;
                      puVar17 = puVar28;
                      if (uVar37 <= *(uint *)(puVar31 + 2)) {
                        puVar17 = puVar31;
                      }
                      puVar31 = puVar17;
                      uVar49 = uVar49 + 1;
                      puVar28 = puVar28 + 4;
                    } while (uVar30 != uVar49);
                    uVar30 = uVar30 - 1;
                    iVar18 = iVar18 + 1;
                  }
                }
                WebPSafeFree(ptr);
                uVar30 = 0;
                do {
                  palette[uVar30] =
                       palette_00
                       [*(byte *)((long)&local_1938 + (ulong)(uVar36 + (int)uVar30) % (ulong)uVar24)
                       ];
                  uVar30 = uVar30 + 1;
                } while (uVar39 != uVar30);
                goto LAB_0013648d;
              }
              WebPSafeFree(ptr);
            }
LAB_001375d5:
            WVar20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
            goto LAB_001375db;
          }
        }
LAB_0013648d:
        iVar18 = enc->palette_size_;
        uVar24 = src->used_;
        if (0x1f < (int)uVar24) {
          VP8LPutBitsFlushBits(src);
          uVar24 = src->used_;
        }
        vVar44 = src->bits_ | 1L << ((ulong)uVar24 & 0x3f);
        src->bits_ = vVar44;
        iVar19 = uVar24 + 1;
        src->used_ = iVar19;
        if (0x1e < (int)uVar24) {
          VP8LPutBitsFlushBits(src);
          iVar19 = src->used_;
          vVar44 = src->bits_;
        }
        vVar44 = 3L << ((byte)iVar19 & 0x3f) | vVar44;
        src->bits_ = vVar44;
        iVar22 = iVar19 + 2;
        src->used_ = iVar22;
        if (0x1d < iVar19) {
          VP8LPutBitsFlushBits(src);
          iVar22 = src->used_;
          vVar44 = src->bits_;
        }
        src->bits_ = (ulong)(iVar18 - 1) << ((byte)iVar22 & 0x3f) | vVar44;
        src->used_ = iVar22 + 8;
        uVar39 = (ulong)(iVar18 - 1);
        if (1 < iVar18) {
          do {
            *(uint32_t *)(buffer + uVar39 * 2) =
                 (palette[uVar39] | 0xff00) - (enc->palette_[uVar39 - 1] & 0xff00ff) & 0xff00ff |
                 (palette[uVar39] | 0xff0000) - (enc->palette_[uVar39 - 1] & 0xff00ff00) &
                 0xff00ff00;
            bVar43 = 1 < uVar39;
            uVar39 = uVar39 - 1;
          } while (bVar43);
        }
        buffer._0_4_ = *palette;
        WVar20 = EncodeImageNoHuffman(src,(uint32_t *)buffer,hash_chain,refs,iVar18,1,0x14,uVar26);
        if (WVar20 != VP8_ENC_OK) goto LAB_001375db;
        pWVar12 = enc->pic_;
        uVar24 = pWVar12->width;
        iVar18 = pWVar12->height;
        puVar58 = pWVar12->argb;
        uVar36 = enc->palette_size_;
        bVar40 = (int)uVar36 < 0x11;
        if ((int)uVar36 < 5) {
          bVar40 = (int)uVar36 < 3 | 2;
        }
        uVar54 = pWVar12->argb_stride;
        WVar20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
        WVar21 = AllocateTransformBuffer(enc,((1 << bVar40) + uVar24) - 1 >> bVar40,iVar18);
        if (WVar21 != VP8_ENC_OK) goto LAB_001375db;
        local_1ac0 = enc->argb_;
        uVar37 = enc->current_width_;
        puVar29 = (uint8_t *)WebPSafeMalloc((long)(int)uVar24,1);
        if (puVar29 == (uint8_t *)0x0) {
          enc->argb_content_ = kEncoderPalette;
          goto LAB_001375db;
        }
        uVar39 = (ulong)uVar24;
        iVar19 = (int)bVar40;
        if ((int)uVar36 < 4) {
          if (0 < iVar18) {
            uVar33 = *palette;
            iVar22 = 0;
            bVar40 = 0;
            do {
              if (0 < (int)uVar24) {
                uVar30 = 0;
                do {
                  uVar8 = puVar58[uVar30];
                  if (uVar8 != uVar33) {
                    uVar33 = uVar8;
                    if (*palette == uVar8) {
                      bVar40 = 0;
                    }
                    else {
                      bVar40 = 1;
                      if (enc->palette_[1] != uVar8) {
                        bVar40 = enc->palette_[2] == uVar8 ^ 3;
                      }
                    }
                  }
                  puVar29[uVar30] = bVar40;
                  uVar30 = uVar30 + 1;
                } while (uVar39 != uVar30);
              }
              (*VP8LBundleColorMap)(puVar29,uVar24,iVar19,local_1ac0);
              local_1ac0 = local_1ac0 + uVar37;
              iVar22 = iVar22 + 1;
              puVar58 = puVar58 + uVar54;
            } while (iVar22 != iVar18);
          }
        }
        else {
          lVar35 = 0;
          do {
            memset(buffer,0xff,0x1000);
            pcVar13 = (code *)(&PTR_ApplyPaletteHash0_0015ad60)[lVar35];
            uVar30 = 0;
            while( true ) {
              uVar23 = (*pcVar13)(palette[uVar30]);
              if (buffer[uVar23] != 0xffff) break;
              buffer[uVar23] = (uint16_t)uVar30;
              uVar30 = uVar30 + 1;
              if (uVar36 == uVar30) {
                iVar22 = (int)lVar35;
                if (iVar22 == 2) {
                  if (0 < iVar18) {
                    uVar36 = *palette;
                    uVar55 = '\0';
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar24) {
                        uVar30 = 0;
                        do {
                          uVar23 = puVar58[uVar30];
                          if (uVar23 != uVar36) {
                            uVar55 = (uint8_t)buffer[uVar23 * -0x80000000 - (uVar23 & 0xffffff) >>
                                                     0x15];
                            uVar36 = uVar23;
                          }
                          puVar29[uVar30] = uVar55;
                          uVar30 = uVar30 + 1;
                        } while (uVar39 != uVar30);
                      }
                      (*VP8LBundleColorMap)(puVar29,uVar24,iVar19,local_1ac0);
                      local_1ac0 = local_1ac0 + uVar37;
                      iVar22 = iVar22 + 1;
                      puVar58 = puVar58 + uVar54;
                    } while (iVar22 != iVar18);
                  }
                  goto LAB_001369f1;
                }
                if (iVar22 == 1) {
                  if (0 < iVar18) {
                    uVar36 = *palette;
                    uVar55 = '\0';
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar24) {
                        uVar30 = 0;
                        do {
                          uVar23 = puVar58[uVar30];
                          if (uVar23 != uVar36) {
                            uVar55 = (uint8_t)buffer[(uVar23 & 0xffffff) * -0x455ab19 >> 0x15];
                            uVar36 = uVar23;
                          }
                          puVar29[uVar30] = uVar55;
                          uVar30 = uVar30 + 1;
                        } while (uVar39 != uVar30);
                      }
                      (*VP8LBundleColorMap)(puVar29,uVar24,iVar19,local_1ac0);
                      local_1ac0 = local_1ac0 + uVar37;
                      iVar22 = iVar22 + 1;
                      puVar58 = puVar58 + uVar54;
                    } while (iVar22 != iVar18);
                  }
                }
                else {
                  if (iVar22 != 0) goto LAB_001367ee;
                  if (0 < iVar18) {
                    uVar36 = *palette;
                    uVar55 = '\0';
                    iVar22 = 0;
                    do {
                      if (0 < (int)uVar24) {
                        uVar30 = 0;
                        do {
                          uVar23 = puVar58[uVar30];
                          if (uVar23 != uVar36) {
                            uVar55 = (uint8_t)buffer[uVar23 >> 8 & 0xff];
                            uVar36 = uVar23;
                          }
                          puVar29[uVar30] = uVar55;
                          uVar30 = uVar30 + 1;
                        } while (uVar39 != uVar30);
                      }
                      (*VP8LBundleColorMap)(puVar29,uVar24,iVar19,local_1ac0);
                      local_1ac0 = local_1ac0 + uVar37;
                      iVar22 = iVar22 + 1;
                      puVar58 = puVar58 + uVar54;
                    } while (iVar22 != iVar18);
                  }
                }
                goto LAB_001369f1;
              }
            }
            lVar35 = lVar35 + 1;
          } while (lVar35 != 3);
LAB_001367ee:
          PrepareMapToPalette(palette,uVar36,palette_sorted,idx_map);
          if (0 < iVar18) {
            uVar23 = *palette;
            uVar33 = 0;
            iVar22 = 0;
            do {
              if (0 < (int)uVar24) {
                uVar30 = 0;
                do {
                  uVar52 = puVar58[uVar30];
                  if (uVar52 != uVar23) {
                    if (palette_sorted[0] == uVar52) {
                      lVar35 = 0;
                    }
                    else {
                      uVar23 = 0;
                      uVar46 = (ulong)uVar36;
                      do {
                        uVar47 = (int)((uint)uVar46 + uVar23) >> 1;
                        lVar35 = (long)(int)uVar47;
                        uVar48 = uVar47;
                        if (palette_sorted[lVar35] < uVar52) {
                          uVar48 = (uint)uVar46;
                          uVar23 = uVar47;
                        }
                        uVar46 = (ulong)uVar48;
                      } while (palette_sorted[lVar35] != uVar52);
                    }
                    uVar33 = idx_map[lVar35];
                    uVar23 = uVar52;
                  }
                  puVar29[uVar30] = (uint8_t)uVar33;
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar39);
              }
              (*VP8LBundleColorMap)(puVar29,uVar24,iVar19,local_1ac0);
              puVar58 = puVar58 + uVar54;
              local_1ac0 = local_1ac0 + uVar37;
              iVar22 = iVar22 + 1;
            } while (iVar22 != iVar18);
          }
        }
LAB_001369f1:
        WebPSafeFree(puVar29);
        enc->argb_content_ = kEncoderPalette;
        if ((iVar3 != 0) && (uVar24 = enc->palette_size_, (int)uVar24 < 0x400)) {
          uVar36 = 0x1f;
          if (uVar24 != 0) {
            for (; uVar24 >> uVar36 == 0; uVar36 = uVar36 - 1) {
            }
          }
          enc->cache_bits_ = (uVar36 ^ 0xffffffe0) + 0x21;
        }
      }
LAB_00136a2a:
      if (enc->use_subtract_green_ != 0) {
        iVar18 = enc->current_width_;
        uVar24 = src->used_;
        if (0x1f < (int)uVar24) {
          VP8LPutBitsFlushBits(src);
          uVar24 = src->used_;
        }
        vVar44 = src->bits_ | 1L << ((ulong)uVar24 & 0x3f);
        src->bits_ = vVar44;
        iVar19 = uVar24 + 1;
        src->used_ = iVar19;
        if (0x1e < (int)uVar24) {
          VP8LPutBitsFlushBits(src);
          iVar19 = src->used_;
          vVar44 = src->bits_;
        }
        src->bits_ = 2L << ((byte)iVar19 & 0x3f) | vVar44;
        src->used_ = iVar19 + 2;
        (*VP8LSubtractGreenFromBlueAndRed)(enc->argb_,iVar18 * height);
      }
      if (enc->use_predict_ != 0) {
        iVar18 = 100;
        if (enc->use_palette_ == 0) {
          iVar18 = enc->config_->near_lossless;
        }
        iVar19 = enc->current_width_;
        iVar22 = enc->transform_bits_;
        VP8LResidualImage(iVar19,height,iVar22,uVar26,enc->argb_,enc->argb_scratch_,
                          enc->transform_data_,iVar18,enc->config_->exact,enc->use_subtract_green_);
        iVar18 = src->used_;
        if (0x1f < iVar18) {
          VP8LPutBitsFlushBits(src);
          iVar18 = src->used_;
        }
        src->bits_ = src->bits_ | 1L << ((byte)iVar18 & 0x3f);
        iVar38 = iVar18 + 1;
        src->used_ = iVar38;
        if (0x1e < iVar18) {
          VP8LPutBitsFlushBits(src);
          iVar38 = src->used_;
        }
        iVar18 = iVar38 + 2;
        src->used_ = iVar18;
        if (0x1d < iVar38) {
          VP8LPutBitsFlushBits(src);
          iVar18 = src->used_;
        }
        bVar40 = (byte)iVar22;
        iVar38 = 1 << (bVar40 & 0x1f);
        src->bits_ = src->bits_ | (ulong)(iVar22 - 2) << ((byte)iVar18 & 0x3f);
        src->used_ = iVar18 + 3;
        WVar20 = EncodeImageNoHuffman
                           (src,enc->transform_data_,hash_chain,refs,
                            (iVar19 + iVar38) - 1U >> (bVar40 & 0x1f),
                            (uint)(height + -1 + iVar38) >> (bVar40 & 0x1f),quality,uVar26);
        if (WVar20 != VP8_ENC_OK) goto LAB_001375db;
      }
      if (enc->use_cross_color_ != 0) {
        iVar18 = enc->current_width_;
        iVar19 = enc->transform_bits_;
        VP8LColorSpaceTransform(iVar18,height,iVar19,quality,enc->argb_,enc->transform_data_);
        uVar24 = src->used_;
        if (0x1f < (int)uVar24) {
          VP8LPutBitsFlushBits(src);
          uVar24 = src->used_;
        }
        vVar44 = src->bits_ | 1L << ((ulong)uVar24 & 0x3f);
        src->bits_ = vVar44;
        uVar36 = uVar24 + 1;
        src->used_ = uVar36;
        if (0x1e < (int)uVar24) {
          VP8LPutBitsFlushBits(src);
          uVar36 = src->used_;
          vVar44 = src->bits_;
        }
        vVar44 = vVar44 | 1L << ((ulong)uVar36 & 0x3f);
        src->bits_ = vVar44;
        iVar22 = uVar36 + 2;
        src->used_ = iVar22;
        if (0x1d < (int)uVar36) {
          VP8LPutBitsFlushBits(src);
          iVar22 = src->used_;
          vVar44 = src->bits_;
        }
        bVar40 = (byte)iVar19;
        iVar38 = 1 << (bVar40 & 0x1f);
        src->bits_ = (ulong)(iVar19 - 2) << ((byte)iVar22 & 0x3f) | vVar44;
        src->used_ = iVar22 + 3;
        WVar20 = EncodeImageNoHuffman
                           (src,enc->transform_data_,hash_chain,refs,
                            (iVar18 + iVar38) - 1U >> (bVar40 & 0x1f),
                            (uint)(height + -1 + iVar38) >> (bVar40 & 0x1f),quality,uVar26);
        if (WVar20 != VP8_ENC_OK) goto LAB_001375db;
      }
      iVar18 = src->used_;
      if (0x1f < iVar18) {
        VP8LPutBitsFlushBits(src);
        iVar18 = src->used_;
      }
      src->used_ = iVar18 + 1;
      iVar18 = enc->histo_bits_;
      bVar40 = (byte)iVar18;
      iVar19 = enc->current_width_;
      uVar24 = ~(-1 << (bVar40 & 0x1f));
      uVar36 = iVar19 + uVar24 >> (bVar40 & 0x1f);
      uVar24 = uVar24 + height >> (bVar40 & 0x1f);
      puVar58 = enc->argb_;
      uVar54 = uVar36 * uVar24;
      uVar39 = (ulong)uVar54;
      huff_tree = (HuffmanTree *)WebPSafeMalloc(0x39,0x10);
      puVar31 = (uint16_t *)WebPSafeMalloc(uVar39,2);
      buffer._0_8_ = src->bits_;
      buffer._8_8_ = *(undefined8 *)&src->used_;
      buffer._16_8_ = src->buf_;
      buffer._24_8_ = src->cur_;
      buffer._32_8_ = src->end_;
      buffer._40_8_ = *(undefined8 *)&src->error_;
      palette_sorted[0] = 0;
      palette_sorted[1] = 0;
      palette_sorted[2] = 0;
      palette_sorted[3] = 0;
      WVar20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
      if ((((huff_tree != (HuffmanTree *)0x0) && (puVar31 != (uint16_t *)0x0)) &&
          (iVar22 = VP8LHashChainInit((VP8LHashChain *)palette_sorted,uVar54), iVar22 != 0)) &&
         (iVar22 = VP8LHashChainFill(hash_chain,quality,puVar58,iVar19,height,uVar26), iVar22 != 0))
      {
        if (iVar3 == 0) {
          iVar22 = 0;
        }
        else {
          iVar22 = enc->cache_bits_;
          if (enc->cache_bits_ == 0) {
            iVar22 = 10;
          }
        }
        iVar38 = VP8LBitWriterInit((VP8LBitWriter *)idx_map,0);
        if (iVar38 != 0) {
          iVar38 = *(int *)((long)input + lVar15 + 0x3c);
          if ((1 < iVar38) || (*(int *)((long)input + lVar15 + 0x30) != 0)) {
            iVar38 = VP8LBitWriterClone(src,(VP8LBitWriter *)idx_map);
            if (iVar38 == 0) goto LAB_0013738a;
            iVar38 = *(int *)((long)input + lVar15 + 0x3c);
          }
          if (0 < iVar38) {
            local_1a08 = 0xffffffffffffffff;
            lVar35 = 0;
            do {
              WVar20 = VP8LGetBackwardReferences
                                 (iVar19,height,puVar58,quality,uVar26,
                                  *(int *)((long)input + lVar35 * 8 + lVar15 + 0x2c),iVar22,
                                  *(int *)((long)input + lVar35 * 8 + lVar15 + 0x30),hash_chain,refs
                                  ,&local_1938);
              if (WVar20 != VP8_ENC_OK) {
                local_1ab0 = (HuffmanTreeCode *)0x0;
                tokens = (HuffmanTreeToken *)0x0;
                local_1ae8 = (VP8LHistogram *)0x0;
                image_histo = (VP8LHistogramSet *)0x0;
                goto LAB_0013738f;
              }
              bVar43 = true;
              bVar40 = 0;
              lVar57 = 0;
              do {
                uVar30 = 0;
                if (bVar43) {
                  uVar30 = (ulong)local_1938;
                }
                if ((bool)(bVar40 & local_1938 == 0)) break;
                VP8LBitWriterReset((VP8LBitWriter *)buffer,src);
                iVar38 = (int)uVar30;
                image_histo = VP8LAllocateHistogramSet(uVar54,iVar38);
                local_1ae8 = VP8LAllocateHistogram(iVar38);
                if ((image_histo == (VP8LHistogramSet *)0x0) || (local_1ae8 == (VP8LHistogram *)0x0)
                   ) {
LAB_00137508:
                  local_1ab0 = (HuffmanTreeCode *)0x0;
                  tokens = (HuffmanTreeToken *)0x0;
                  WVar20 = VP8_ENC_OK;
                  goto LAB_0013738f;
                }
                iVar25 = VP8LGetHistoImageSymbols
                                   (iVar19,height,refs + lVar57,quality,uVar26,iVar18,iVar38,
                                    image_histo,local_1ae8,puVar31);
                if (iVar25 == 0) goto LAB_00137508;
                uVar37 = image_histo->size;
                uVar23 = uVar37 * 5;
                local_1ab0 = (HuffmanTreeCode *)WebPSafeCalloc((long)(int)uVar23,0x18);
                if (local_1ab0 == (HuffmanTreeCode *)0x0) {
                  local_1ab0 = (HuffmanTreeCode *)0x0;
LAB_00137572:
                  WVar20 = VP8_ENC_OK;
LAB_00137575:
                  tokens = (HuffmanTreeToken *)0x0;
                  goto LAB_0013738f;
                }
                iVar25 = GetHuffBitLengthsAndCodes(image_histo,local_1ab0);
                if (iVar25 == 0) goto LAB_00137572;
                VP8LFreeHistogramSet(image_histo);
                VP8LFreeHistogram(local_1ae8);
                uVar52 = src->used_;
                if (iVar38 < 1) {
                  if (0x1f < (int)uVar52) {
                    VP8LPutBitsFlushBits(src);
                    uVar52 = src->used_;
                  }
                  iVar25 = uVar52 + 1;
                }
                else {
                  if (0x1f < (int)uVar52) {
                    VP8LPutBitsFlushBits(src);
                    uVar52 = src->used_;
                  }
                  vVar44 = src->bits_ | 1L << ((ulong)uVar52 & 0x3f);
                  src->bits_ = vVar44;
                  iVar25 = uVar52 + 1;
                  src->used_ = iVar25;
                  if (0x1e < (int)uVar52) {
                    VP8LPutBitsFlushBits(src);
                    iVar25 = src->used_;
                    vVar44 = src->bits_;
                  }
                  src->bits_ = uVar30 << ((byte)iVar25 & 0x3f) | vVar44;
                  iVar25 = iVar25 + 4;
                }
                src->used_ = iVar25;
                if (0x1f < iVar25) {
                  VP8LPutBitsFlushBits(src);
                  iVar25 = src->used_;
                }
                src->bits_ = src->bits_ | (ulong)(1 < (int)uVar37) << ((byte)iVar25 & 0x3f);
                src->used_ = iVar25 + 1;
                if (1 < (int)uVar37) {
                  puVar32 = (uint32_t *)WebPSafeMalloc(uVar39,4);
                  if (puVar32 == (uint32_t *)0x0) goto LAB_0013756f;
                  if (uVar39 == 0) {
                    uVar37 = 0;
                  }
                  else {
                    uVar30 = 0;
                    uVar37 = 0;
                    do {
                      uVar2 = puVar31[uVar30];
                      puVar32[uVar30] = (uint)uVar2 << 8;
                      if (uVar37 <= uVar2) {
                        uVar37 = uVar2 + 1;
                      }
                      uVar30 = uVar30 + 1;
                    } while (uVar39 != uVar30);
                  }
                  iVar25 = src->used_;
                  if (0x1f < iVar25) {
                    VP8LPutBitsFlushBits(src);
                    iVar25 = src->used_;
                  }
                  src->bits_ = src->bits_ | (ulong)(iVar18 - 2) << ((byte)iVar25 & 0x3f);
                  src->used_ = iVar25 + 3;
                  WVar20 = EncodeImageNoHuffman
                                     (src,puVar32,(VP8LHashChain *)palette_sorted,enc->refs_ + 2,
                                      uVar36,uVar24,quality,uVar26);
                  WebPSafeFree(puVar32);
                  if (WVar20 == VP8_ENC_OK) {
                    uVar23 = uVar37 * 5;
                    goto LAB_0013717b;
                  }
                  local_1ae8 = (VP8LHistogram *)0x0;
                  image_histo = (VP8LHistogramSet *)0x0;
                  goto LAB_00137575;
                }
LAB_0013717b:
                if ((int)uVar37 < 1) {
                  tokens = (HuffmanTreeToken *)WebPSafeMalloc(0,2);
                  if (tokens == (HuffmanTreeToken *)0x0) goto LAB_0013756f;
                }
                else {
                  if ((int)uVar23 < 2) {
                    uVar23 = 1;
                  }
                  uVar30 = (ulong)uVar23;
                  lVar34 = 0;
                  uVar37 = 0;
                  do {
                    uVar23 = *(uint *)((long)&local_1ab0->num_symbols + lVar34);
                    if ((int)uVar23 < (int)uVar37) {
                      uVar23 = uVar37;
                    }
                    uVar37 = uVar23;
                    lVar34 = lVar34 + 0x18;
                  } while (uVar30 * 0x18 != lVar34);
                  tokens = (HuffmanTreeToken *)WebPSafeMalloc((ulong)uVar37,2);
                  huffman_code = local_1ab0;
                  if (tokens == (HuffmanTreeToken *)0x0) {
LAB_0013756f:
                    local_1ae8 = (VP8LHistogram *)0x0;
                    image_histo = (VP8LHistogramSet *)0x0;
                    goto LAB_00137572;
                  }
                  do {
                    StoreHuffmanCode(src,huff_tree,tokens,huffman_code);
                    ClearHuffmanTreeIfOnlyOneSymbol(huffman_code);
                    huffman_code = huffman_code + 1;
                    uVar30 = uVar30 - 1;
                  } while (uVar30 != 0);
                }
                puVar29 = src->cur_;
                iVar25 = src->used_;
                puVar11 = src->buf_;
                WVar20 = StoreImageToBitMask(src,iVar19,iVar18,refs + lVar57,puVar31,local_1ab0);
                if (WVar20 != VP8_ENC_OK) {
                  WVar20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
                  local_1ae8 = (VP8LHistogram *)0x0;
                  image_histo = (VP8LHistogramSet *)0x0;
                  goto LAB_0013738f;
                }
                lVar57 = (long)src->cur_ - (long)src->buf_;
                uVar30 = (src->used_ + 7 >> 3) + lVar57;
                if (uVar30 < local_1a08) {
                  local_1a58 = ((int)puVar29 - ((int)puVar11 + iVar7)) + (iVar25 + 7 >> 3);
                  enc->cache_bits_ = iVar38;
                  local_1a5c = ((int)lVar57 - (iVar7 + local_1a58)) + (src->used_ + 7 >> 3);
                  VP8LBitWriterSwap(src,(VP8LBitWriter *)idx_map);
                  local_1a08 = uVar30;
                }
                WebPSafeFree(tokens);
                WebPSafeFree(local_1ab0->codes);
                WebPSafeFree(local_1ab0);
                lVar57 = 1;
                bVar40 = 1;
                bVar14 = (bool)(bVar43 & *(int *)((long)input + lVar35 * 8 + lVar15 + 0x30) != 0);
                bVar43 = false;
              } while (bVar14);
              lVar35 = lVar35 + 1;
            } while (lVar35 < *(int *)((long)input + lVar15 + 0x3c));
          }
          VP8LBitWriterSwap(src,(VP8LBitWriter *)idx_map);
          WVar20 = VP8_ENC_OK;
        }
      }
LAB_0013738a:
      local_1ae8 = (VP8LHistogram *)0x0;
      tokens = (HuffmanTreeToken *)0x0;
      local_1ab0 = (HuffmanTreeCode *)0x0;
      image_histo = (VP8LHistogramSet *)0x0;
LAB_0013738f:
      WebPSafeFree(tokens);
      WebPSafeFree(huff_tree);
      VP8LFreeHistogramSet(image_histo);
      VP8LFreeHistogram(local_1ae8);
      VP8LHashChainClear((VP8LHashChain *)palette_sorted);
      if (local_1ab0 != (HuffmanTreeCode *)0x0) {
        WebPSafeFree(local_1ab0->codes);
        WebPSafeFree(local_1ab0);
      }
      WebPSafeFree(puVar31);
      VP8LBitWriterWipeOut((VP8LBitWriter *)idx_map);
      if (WVar20 != VP8_ENC_OK) goto LAB_001375db;
      puVar29 = src->cur_ + ((long)(src->used_ + 7 >> 3) - (long)src->buf_);
      if ((puVar29 < local_1a40) &&
         (VP8LBitWriterSwap(src,&bw_best), local_1a40 = puVar29, lVar10 != 0)) {
        uVar26 = (uint)(enc->use_predict_ != 0);
        *(uint *)(lVar10 + 0x94) = uVar26;
        if (enc->use_cross_color_ != 0) {
          uVar26 = uVar26 | 2;
          *(uint *)(lVar10 + 0x94) = uVar26;
        }
        if (enc->use_subtract_green_ != 0) {
          uVar26 = uVar26 | 4;
          *(uint *)(lVar10 + 0x94) = uVar26;
        }
        if (enc->use_palette_ != 0) {
          *(uint *)(lVar10 + 0x94) = uVar26 | 8;
        }
        *(undefined8 *)(lVar10 + 0x98) = *(undefined8 *)&enc->histo_bits_;
        *(int *)(lVar10 + 0xa0) = enc->cache_bits_;
        *(int *)(lVar10 + 0xa4) = enc->palette_size_;
        *(int *)(lVar10 + 0xa8) = (int)puVar29 - iVar7;
        *(int *)(lVar10 + 0xac) = local_1a58;
        *(int *)(lVar10 + 0xb0) = local_1a5c;
      }
      if (1 < (int)uVar4) {
        VP8LBitWriterReset(&bw_init,src);
      }
      uVar59 = uVar59 + 1;
    } while (uVar59 != uVar4);
  }
  VP8LBitWriterSwap(&bw_best,src);
  WVar20 = VP8_ENC_OK;
LAB_001375db:
  VP8LBitWriterWipeOut(&bw_best);
  *(WebPEncodingError *)((long)input + 0x10c) = WVar20;
  return (int)(WVar20 == VP8_ENC_OK);
}

Assistant:

static int EncodeStreamHook(void* input, void* data2) {
  StreamEncodeContext* const params = (StreamEncodeContext*)input;
  const WebPConfig* const config = params->config_;
  const WebPPicture* const picture = params->picture_;
  VP8LBitWriter* const bw = params->bw_;
  VP8LEncoder* const enc = params->enc_;
  const int use_cache = params->use_cache_;
  const CrunchConfig* const crunch_configs = params->crunch_configs_;
  const int num_crunch_configs = params->num_crunch_configs_;
  const int red_and_blue_always_zero = params->red_and_blue_always_zero_;
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = params->stats_;
#endif
  WebPEncodingError err = VP8_ENC_OK;
  const int quality = (int)config->quality;
  const int low_effort = (config->method == 0);
#if (WEBP_NEAR_LOSSLESS == 1)
  const int width = picture->width;
#endif
  const int height = picture->height;
  const size_t byte_position = VP8LBitWriterNumBytes(bw);
#if (WEBP_NEAR_LOSSLESS == 1)
  int use_near_lossless = 0;
#endif
  int hdr_size = 0;
  int data_size = 0;
  int use_delta_palette = 0;
  int idx;
  size_t best_size = ~(size_t)0;
  VP8LBitWriter bw_init = *bw, bw_best;
  (void)data2;

  if (!VP8LBitWriterInit(&bw_best, 0) ||
      (num_crunch_configs > 1 && !VP8LBitWriterClone(bw, &bw_best))) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  for (idx = 0; idx < num_crunch_configs; ++idx) {
    const int entropy_idx = crunch_configs[idx].entropy_idx_;
    enc->use_palette_ =
        (entropy_idx == kPalette) || (entropy_idx == kPaletteAndSpatial);
    enc->use_subtract_green_ =
        (entropy_idx == kSubGreen) || (entropy_idx == kSpatialSubGreen);
    enc->use_predict_ = (entropy_idx == kSpatial) ||
                        (entropy_idx == kSpatialSubGreen) ||
                        (entropy_idx == kPaletteAndSpatial);
    // When using a palette, R/B==0, hence no need to test for cross-color.
    if (low_effort || enc->use_palette_) {
      enc->use_cross_color_ = 0;
    } else {
      enc->use_cross_color_ = red_and_blue_always_zero ? 0 : enc->use_predict_;
    }
    // Reset any parameter in the encoder that is set in the previous iteration.
    enc->cache_bits_ = 0;
    VP8LBackwardRefsClear(&enc->refs_[0]);
    VP8LBackwardRefsClear(&enc->refs_[1]);

#if (WEBP_NEAR_LOSSLESS == 1)
    // Apply near-lossless preprocessing.
    use_near_lossless = (config->near_lossless < 100) && !enc->use_palette_ &&
                        !enc->use_predict_;
    if (use_near_lossless) {
      err = AllocateTransformBuffer(enc, width, height);
      if (err != VP8_ENC_OK) goto Error;
      if ((enc->argb_content_ != kEncoderNearLossless) &&
          !VP8ApplyNearLossless(picture, config->near_lossless, enc->argb_)) {
        err = VP8_ENC_ERROR_OUT_OF_MEMORY;
        goto Error;
      }
      enc->argb_content_ = kEncoderNearLossless;
    } else {
      enc->argb_content_ = kEncoderNone;
    }
#else
    enc->argb_content_ = kEncoderNone;
#endif

    // Encode palette
    if (enc->use_palette_) {
      if (crunch_configs[idx].palette_sorting_type_ == kSortedDefault) {
        // Nothing to do, we have already sorted the palette.
        memcpy(enc->palette_, enc->palette_sorted_,
               enc->palette_size_ * sizeof(*enc->palette_));
      } else if (crunch_configs[idx].palette_sorting_type_ == kMinimizeDelta) {
        PaletteSortMinimizeDeltas(enc->palette_sorted_, enc->palette_size_,
                                  enc->palette_);
      } else {
        assert(crunch_configs[idx].palette_sorting_type_ == kModifiedZeng);
        err = PaletteSortModifiedZeng(enc->pic_, enc->palette_sorted_,
                                      enc->palette_size_, enc->palette_);
        if (err != VP8_ENC_OK) goto Error;
      }
      err = EncodePalette(bw, low_effort, enc);
      if (err != VP8_ENC_OK) goto Error;
      err = MapImageFromPalette(enc, use_delta_palette);
      if (err != VP8_ENC_OK) goto Error;
      // If using a color cache, do not have it bigger than the number of
      // colors.
      if (use_cache && enc->palette_size_ < (1 << MAX_COLOR_CACHE_BITS)) {
        enc->cache_bits_ = BitsLog2Floor(enc->palette_size_) + 1;
      }
    }
    if (!use_delta_palette) {
      // In case image is not packed.
      if (enc->argb_content_ != kEncoderNearLossless &&
          enc->argb_content_ != kEncoderPalette) {
        err = MakeInputImageCopy(enc);
        if (err != VP8_ENC_OK) goto Error;
      }

      // -----------------------------------------------------------------------
      // Apply transforms and write transform data.

      if (enc->use_subtract_green_) {
        ApplySubtractGreen(enc, enc->current_width_, height, bw);
      }

      if (enc->use_predict_) {
        err = ApplyPredictFilter(enc, enc->current_width_, height, quality,
                                 low_effort, enc->use_subtract_green_, bw);
        if (err != VP8_ENC_OK) goto Error;
      }

      if (enc->use_cross_color_) {
        err = ApplyCrossColorFilter(enc, enc->current_width_, height, quality,
                                    low_effort, bw);
        if (err != VP8_ENC_OK) goto Error;
      }
    }

    VP8LPutBits(bw, !TRANSFORM_PRESENT, 1);  // No more transforms.

    // -------------------------------------------------------------------------
    // Encode and write the transformed image.
    err = EncodeImageInternal(bw, enc->argb_, &enc->hash_chain_, enc->refs_,
                              enc->current_width_, height, quality, low_effort,
                              use_cache, &crunch_configs[idx],
                              &enc->cache_bits_, enc->histo_bits_,
                              byte_position, &hdr_size, &data_size);
    if (err != VP8_ENC_OK) goto Error;

    // If we are better than what we already have.
    if (VP8LBitWriterNumBytes(bw) < best_size) {
      best_size = VP8LBitWriterNumBytes(bw);
      // Store the BitWriter.
      VP8LBitWriterSwap(bw, &bw_best);
#if !defined(WEBP_DISABLE_STATS)
      // Update the stats.
      if (stats != NULL) {
        stats->lossless_features = 0;
        if (enc->use_predict_) stats->lossless_features |= 1;
        if (enc->use_cross_color_) stats->lossless_features |= 2;
        if (enc->use_subtract_green_) stats->lossless_features |= 4;
        if (enc->use_palette_) stats->lossless_features |= 8;
        stats->histogram_bits = enc->histo_bits_;
        stats->transform_bits = enc->transform_bits_;
        stats->cache_bits = enc->cache_bits_;
        stats->palette_size = enc->palette_size_;
        stats->lossless_size = (int)(best_size - byte_position);
        stats->lossless_hdr_size = hdr_size;
        stats->lossless_data_size = data_size;
      }
#endif
    }
    // Reset the bit writer for the following iteration if any.
    if (num_crunch_configs > 1) VP8LBitWriterReset(&bw_init, bw);
  }
  VP8LBitWriterSwap(&bw_best, bw);

Error:
  VP8LBitWriterWipeOut(&bw_best);
  params->err_ = err;
  // The hook should return false in case of error.
  return (err == VP8_ENC_OK);
}